

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O3

void __thiscall sznet::net::KcpWithTcpServer::~KcpWithTcpServer(KcpWithTcpServer *this)

{
  _Base_ptr *pp_Var1;
  KcpTcpEventLoop *this_00;
  ulong __n;
  _Base_ptr p_Var2;
  _Base_ptr this_01;
  _Manager_type p_Var3;
  pointer pIVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  pointer pcVar5;
  int iVar6;
  KcpWithTcpServer *pKVar7;
  bool bVar8;
  uint uVar9;
  _Base_ptr p_Var10;
  _Base_ptr this_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  EventLoop *this_04;
  SourceFile file;
  Logger local_1038;
  _Any_data local_68;
  code *pcStack_58;
  code *pcStack_50;
  _Rb_tree_node_base *local_40;
  KcpWithTcpServer *local_38;
  
  this_00 = this->m_loop;
  bVar8 = EventLoop::isInLoopThread(&this_00->super_EventLoop);
  if (!bVar8) {
    EventLoop::abortNotInLoopThread(&this_00->super_EventLoop);
  }
  if (g_logLevel < 1) {
    file._8_8_ = 0x14;
    file.m_data = "KcpWithTcpServer.cpp";
    Logger::Logger(&local_1038,file,0x21,TRACE,"~KcpWithTcpServer");
    iVar6 = (int)&local_1038 + 0xfb0;
    uVar9 = iVar6 - (int)local_1038.m_impl.m_stream.m_buffer.m_cur;
    if (0x25 < uVar9) {
      builtin_strncpy(local_1038.m_impl.m_stream.m_buffer.m_cur,
                      "KcpWithTcpServer::~KcpWithTcpServer [",0x25);
      local_1038.m_impl.m_stream.m_buffer.m_cur = local_1038.m_impl.m_stream.m_buffer.m_cur + 0x25;
      uVar9 = iVar6 - (int)local_1038.m_impl.m_stream.m_buffer.m_cur;
    }
    __n = (this->m_name)._M_string_length;
    if (__n < (ulong)(long)(int)uVar9) {
      memcpy(local_1038.m_impl.m_stream.m_buffer.m_cur,(this->m_name)._M_dataplus._M_p,__n);
      local_1038.m_impl.m_stream.m_buffer.m_cur = local_1038.m_impl.m_stream.m_buffer.m_cur + __n;
      uVar9 = iVar6 - (int)local_1038.m_impl.m_stream.m_buffer.m_cur;
    }
    if (0xd < uVar9) {
      builtin_strncpy(local_1038.m_impl.m_stream.m_buffer.m_cur,"] destructing",0xd);
      local_1038.m_impl.m_stream.m_buffer.m_cur = local_1038.m_impl.m_stream.m_buffer.m_cur + 0xd;
    }
    Logger::~Logger(&local_1038);
  }
  p_Var10 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_38 = this;
  if (p_Var10 != local_40) {
    do {
      p_Var2 = p_Var10[1]._M_parent;
      this_01 = p_Var10[1]._M_left;
      pp_Var1 = &p_Var10[1]._M_parent;
      if (this_01 == (_Base_ptr)0x0) {
        *pp_Var1 = (_Base_ptr)0x0;
        p_Var10[1]._M_left = (_Base_ptr)0x0;
        this_04 = (EventLoop *)p_Var2->_M_left;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
          UNLOCK();
          this_03 = p_Var10[1]._M_left;
          *pp_Var1 = (_Base_ptr)0x0;
          p_Var10[1]._M_left = (_Base_ptr)0x0;
          if (this_03 != (_Base_ptr)0x0) goto LAB_00130f7e;
        }
        else {
          *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
          *pp_Var1 = (_Base_ptr)0x0;
          p_Var10[1]._M_left = (_Base_ptr)0x0;
          this_03 = this_01;
LAB_00130f7e:
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03);
        }
        this_04 = (EventLoop *)p_Var2->_M_left;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
        }
      }
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      pcStack_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_68._M_unused._M_object = operator_new(0x20);
      pcStack_50 = std::
                   _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>_>
                   ::_M_invoke;
      *(code **)local_68._M_unused._0_8_ = TcpConnection::connectDestroyed;
      *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
      *(_Base_ptr *)((long)local_68._M_unused._0_8_ + 0x10) = p_Var2;
      *(_Base_ptr *)((long)local_68._M_unused._0_8_ + 0x18) = this_01;
      pcStack_58 = std::
                   _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>_>
                   ::_M_manager;
      EventLoop::runInLoop(this_04,(Functor *)&local_68);
      if (pcStack_58 != (code *)0x0) {
        (*pcStack_58)(&local_68,&local_68,__destroy_functor);
      }
      if (this_01 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != local_40);
  }
  pKVar7 = local_38;
  p_Var3 = (local_38->m_tcpCodec).m_messageCallback.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&local_38->m_tcpCodec,(_Any_data *)&local_38->m_tcpCodec,
              __destroy_functor);
  }
  pIVar4 = (pKVar7->m_udpListenAddrs).
           super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pIVar4 != (pointer)0x0) {
    operator_delete(pIVar4);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
  ::~_Rb_tree(&(pKVar7->m_connections)._M_t);
  p_Var3 = (pKVar7->m_threadInitCallback).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&pKVar7->m_threadInitCallback,(_Any_data *)&pKVar7->m_threadInitCallback,
              __destroy_functor);
  }
  p_Var3 = (pKVar7->m_kcpWriteCompleteCallback).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&pKVar7->m_kcpWriteCompleteCallback,
              (_Any_data *)&pKVar7->m_kcpWriteCompleteCallback,__destroy_functor);
  }
  p_Var3 = (pKVar7->m_kcpMessageCallback).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&pKVar7->m_kcpMessageCallback,(_Any_data *)&pKVar7->m_kcpMessageCallback,
              __destroy_functor);
  }
  p_Var3 = (pKVar7->m_kcpConnectionCallback).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&pKVar7->m_kcpConnectionCallback,
              (_Any_data *)&pKVar7->m_kcpConnectionCallback,__destroy_functor);
  }
  this_02 = (pKVar7->m_threadPool).
            super___shared_ptr<sznet::net::KcpTcpEventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  std::unique_ptr<sznet::net::Acceptor,_std::default_delete<sznet::net::Acceptor>_>::~unique_ptr
            (&pKVar7->m_acceptor);
  pcVar5 = (pKVar7->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != &(pKVar7->m_name).field_2) {
    operator_delete(pcVar5);
  }
  pcVar5 = (pKVar7->m_ipPort)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != &(pKVar7->m_ipPort).field_2) {
    operator_delete(pcVar5);
  }
  return;
}

Assistant:

KcpWithTcpServer::~KcpWithTcpServer()
{
	m_loop->assertInLoopThread();
	LOG_TRACE << "KcpWithTcpServer::~KcpWithTcpServer [" << m_name << "] destructing";

	for (auto& item : m_connections)
	{
		TcpConnectionPtr conn(item.second);
		item.second.reset();
		conn->getLoop()->runInLoop(std::bind(&TcpConnection::connectDestroyed, conn));
	}
}